

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

void duckdb::SchemaDiscovery
               (ClientContext *context,ReadCSVData *result,CSVReaderOptions *options,
               MultiFileOptions *file_options,vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,MultiFileList *multi_file_list)

{
  shared_ptr<duckdb::CSVBufferManager,_true> *this;
  LogicalType *pLVar1;
  pointer pCVar2;
  bool bVar3;
  CSVStateMachineCache *pCVar4;
  idx_t iVar5;
  const_reference __args_2;
  CSVBufferManager *pCVar6;
  CSVBufferHandle *pCVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  CSVSchema *schema;
  pointer this_00;
  LogicalType *this_01;
  vector<duckdb::CSVSchema,_true> *__range1;
  vector<duckdb::CSVSchema,_true> schemas;
  ulong local_ba8;
  undefined1 local_b90 [16];
  idx_t rows_read;
  vector<duckdb::OpenFileInfo,_true> file_paths;
  idx_t rows_read_1;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_b38;
  SnifferResult sniffer_result_1;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_af8;
  SnifferResult sniffer_result;
  CSVSchema best_schema;
  __buckets_ptr local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8 [13];
  CSVReaderOptions option_og;
  
  schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>.
  super__Vector_base<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>.
  super__Vector_base<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>.
  super__Vector_base<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CSVReaderOptions::CSVReaderOptions(&option_og,options);
  (*multi_file_list->_vptr_MultiFileList[4])(&file_paths);
  iVar10 = options->sample_size_chunks;
  vector<duckdb::OpenFileInfo,_true>::get<true>(&file_paths,0);
  ::std::__cxx11::string::_M_assign((string *)&options->file_path);
  sniffer_result.return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  make_shared_ptr<duckdb::CSVBufferManager,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,bool>
            ((ClientContext *)&best_schema,(CSVReaderOptions *)context,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options,
             (bool *)&options->file_path);
  this = &result->buffer_manager;
  shared_ptr<duckdb::CSVBufferManager,_true>::operator=
            (this,(shared_ptr<duckdb::CSVBufferManager,_true> *)&best_schema);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &best_schema.columns.
              super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b38,(__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)this);
  pCVar4 = CSVStateMachineCache::Get(context);
  CSVSniffer::CSVSniffer
            ((CSVSniffer *)&best_schema,options,file_options,
             (shared_ptr<duckdb::CSVBufferManager,_true> *)&local_b38,pCVar4,true);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b38._M_refcount);
  CSVSniffer::SniffCSV(&sniffer_result,(CSVSniffer *)&best_schema,false);
  iVar5 = CSVSniffer::LinesSniffed((CSVSniffer *)&best_schema);
  rows_read = iVar5 - ((ulong)(options->dialect_options).header.value +
                      (options->dialect_options).skip_rows.value);
  __args_2 = vector<duckdb::OpenFileInfo,_true>::get<true>(&file_paths,0);
  pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this);
  CSVBufferManager::GetBuffer((CSVBufferManager *)&sniffer_result_1,(idx_t)pCVar6);
  pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     ((shared_ptr<duckdb::CSVBufferHandle,_true> *)&sniffer_result_1);
  local_b90[0] = pCVar7->actual_size == 0;
  ::std::vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>>::
  emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,std::__cxx11::string_const&,unsigned_long&,bool>
            ((vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>> *)&schemas,
             &sniffer_result.names,&sniffer_result.return_types,&__args_2->path,&rows_read,
             (bool *)local_b90);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &sniffer_result_1.return_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish);
  iVar5 = CSVSniffer::LinesSniffed((CSVSniffer *)&best_schema);
  bVar3 = CSVSniffer::EmptyOrOnlyHeader((CSVSniffer *)&best_schema);
  local_ba8 = (ulong)bVar3;
  SnifferResult::~SnifferResult(&sniffer_result);
  CSVSniffer::~CSVSniffer((CSVSniffer *)&best_schema);
  uVar8 = ((long)file_paths.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)file_paths.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                .super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  uVar11 = 10;
  if (uVar8 < 10) {
    uVar11 = uVar8;
  }
  for (uVar8 = 1;
      (pCVar2 = schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>.
                super__Vector_base<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>._M_impl.
                super__Vector_impl_data._M_finish, iVar5 < iVar10 << 0xb && (uVar8 < uVar11));
      uVar8 = uVar8 + 1) {
    CSVReaderOptions::CSVReaderOptions((CSVReaderOptions *)&best_schema,&option_og);
    vector<duckdb::OpenFileInfo,_true>::get<true>(&file_paths,uVar8);
    ::std::__cxx11::string::_M_assign((string *)local_5d8);
    sniffer_result.return_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    make_shared_ptr<duckdb::CSVBufferManager,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,bool>
              ((ClientContext *)&rows_read,(CSVReaderOptions *)context,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&best_schema,
               (bool *)local_5d8);
    ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_af8,
               (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)&rows_read);
    pCVar4 = CSVStateMachineCache::Get(context);
    CSVSniffer::CSVSniffer
              ((CSVSniffer *)&sniffer_result,(CSVReaderOptions *)&best_schema,file_options,
               (shared_ptr<duckdb::CSVBufferManager,_true> *)&local_af8,pCVar4,true);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_af8._M_refcount);
    CSVSniffer::SniffCSV(&sniffer_result_1,(CSVSniffer *)&sniffer_result,false);
    iVar9 = CSVSniffer::LinesSniffed((CSVSniffer *)&sniffer_result);
    rows_read_1 = iVar9 - ((best_schema.name_idx_map._M_h._M_rehash_policy._M_next_resize >> 8 &
                           0xff) + (long)local_7c8);
    pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferManager,_true> *)&rows_read);
    CSVBufferManager::GetBuffer((CSVBufferManager *)local_b90,(idx_t)pCVar6);
    pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_b90);
    iVar9 = pCVar7->actual_size;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b90 + 8));
    if (iVar9 == 0) {
      local_b90[0] = true;
      ::std::vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>::emplace_back<bool>
                (&schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>,
                 (bool *)local_b90);
    }
    else {
      ::std::vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>>::
      emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,std::__cxx11::string&,unsigned_long&>
                ((vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>> *)&schemas,
                 &sniffer_result_1.names,&sniffer_result_1.return_types,local_5d8,&rows_read_1);
    }
    iVar9 = CSVSniffer::LinesSniffed((CSVSniffer *)&sniffer_result);
    bVar3 = CSVSniffer::EmptyOrOnlyHeader((CSVSniffer *)&sniffer_result);
    iVar5 = iVar5 + iVar9;
    local_ba8 = local_ba8 + bVar3;
    SnifferResult::~SnifferResult(&sniffer_result_1);
    CSVSniffer::~CSVSniffer((CSVSniffer *)&sniffer_result);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff488);
    CSVReaderOptions::~CSVReaderOptions((CSVReaderOptions *)&best_schema);
  }
  best_schema.name_idx_map._M_h._M_buckets = &best_schema.name_idx_map._M_h._M_single_bucket;
  best_schema.columns.super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  best_schema.columns.super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  best_schema.columns.super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  best_schema.name_idx_map._M_h._M_bucket_count = 1;
  best_schema.name_idx_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  best_schema.name_idx_map._M_h._M_element_count = 0;
  best_schema.name_idx_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  best_schema.name_idx_map._M_h._M_rehash_policy._M_next_resize = 0;
  best_schema.name_idx_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  best_schema.file_path._M_dataplus._M_p = (pointer)&best_schema.file_path.field_2;
  best_schema.file_path._M_string_length = 0;
  best_schema.file_path.field_2._M_local_buf[0] = '\0';
  best_schema.rows_read = 0;
  best_schema.empty = false;
  this_00 = schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>.
            super__Vector_base<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (this_00 == pCVar2) {
      if ((names->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (names->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        CSVSchema::GetNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&sniffer_result,&best_schema);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)names,&sniffer_result);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sniffer_result);
        CSVSchema::GetTypes(&sniffer_result.return_types,&best_schema);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                  (&return_types->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &sniffer_result);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   &sniffer_result);
      }
      if ((uVar8 == local_ba8) && (options->columns_set == false)) {
        pLVar1 = (return_types->
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (this_01 = (return_types->
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_01 != pLVar1;
            this_01 = this_01 + 1) {
          LogicalType::LogicalType((LogicalType *)&sniffer_result,VARCHAR);
          LogicalType::operator=(this_01,(LogicalType *)&sniffer_result);
          LogicalType::~LogicalType((LogicalType *)&sniffer_result);
        }
      }
      CSVSchema::operator=(&result->csv_schema,&best_schema);
      CSVSchema::~CSVSchema(&best_schema);
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                (&file_paths.
                  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>);
      CSVReaderOptions::~CSVReaderOptions(&option_og);
      ::std::vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>::~vector
                (&schemas.super_vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>);
      return;
    }
    bVar3 = CSVSchema::Empty(&best_schema);
    if (bVar3) {
LAB_00997792:
      CSVSchema::operator=(&best_schema,this_00);
    }
    else {
      iVar10 = CSVSchema::GetRowsRead(&best_schema);
      if (iVar10 == 0) goto LAB_00997792;
      iVar10 = CSVSchema::GetRowsRead(this_00);
      if (iVar10 != 0) {
        CSVSchema::MergeSchemas(&best_schema,this_00,options->null_padding);
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void SchemaDiscovery(ClientContext &context, ReadCSVData &result, CSVReaderOptions &options,
                     const MultiFileOptions &file_options, vector<LogicalType> &return_types, vector<string> &names,
                     MultiFileList &multi_file_list) {
	vector<CSVSchema> schemas;
	const auto option_og = options;

	const auto file_paths = multi_file_list.GetAllFiles();

	// Here what we want to do is to sniff a given number of lines, if we have many files, we might go through them
	// to reach the number of lines.
	const idx_t required_number_of_lines = options.sniff_size * options.sample_size_chunks;

	idx_t total_number_of_rows = 0;
	idx_t current_file = 0;
	options.file_path = file_paths[current_file].path;

	result.buffer_manager = make_shared_ptr<CSVBufferManager>(context, options, options.file_path, false);
	idx_t only_header_or_empty_files = 0;

	{
		CSVSniffer sniffer(options, file_options, result.buffer_manager, CSVStateMachineCache::Get(context));
		auto sniffer_result = sniffer.SniffCSV();
		idx_t rows_read = sniffer.LinesSniffed() -
		                  (options.dialect_options.skip_rows.GetValue() + options.dialect_options.header.GetValue());

		schemas.emplace_back(sniffer_result.names, sniffer_result.return_types, file_paths[0].path, rows_read,
		                     result.buffer_manager->GetBuffer(0)->actual_size == 0);
		total_number_of_rows += sniffer.LinesSniffed();
		current_file++;
		if (sniffer.EmptyOrOnlyHeader()) {
			only_header_or_empty_files++;
		}
	}

	// We do a copy of the options to not pollute the options of the first file.
	constexpr idx_t max_files_to_sniff = 10;
	idx_t files_to_sniff = file_paths.size() > max_files_to_sniff ? max_files_to_sniff : file_paths.size();
	while (total_number_of_rows < required_number_of_lines && current_file < files_to_sniff) {
		auto option_copy = option_og;
		option_copy.file_path = file_paths[current_file].path;
		auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, option_copy, option_copy.file_path, false);
		// TODO: We could cache the sniffer to be reused during scanning. Currently that's an exercise left to the
		// reader
		CSVSniffer sniffer(option_copy, file_options, buffer_manager, CSVStateMachineCache::Get(context));
		auto sniffer_result = sniffer.SniffCSV();
		idx_t rows_read = sniffer.LinesSniffed() - (option_copy.dialect_options.skip_rows.GetValue() +
		                                            option_copy.dialect_options.header.GetValue());
		if (buffer_manager->GetBuffer(0)->actual_size == 0) {
			schemas.emplace_back(true);
		} else {
			schemas.emplace_back(sniffer_result.names, sniffer_result.return_types, option_copy.file_path, rows_read);
		}
		total_number_of_rows += sniffer.LinesSniffed();
		if (sniffer.EmptyOrOnlyHeader()) {
			only_header_or_empty_files++;
		}
		current_file++;
	}

	// We might now have multiple schemas, we need to go through them to define the one true schema
	CSVSchema best_schema;
	for (auto &schema : schemas) {
		if (best_schema.Empty()) {
			// A schema is bettah than no schema
			best_schema = schema;
		} else if (best_schema.GetRowsRead() == 0) {
			// If the best-schema has no data-rows, that's easy, we just take the new schema
			best_schema = schema;
		} else if (schema.GetRowsRead() != 0) {
			// We might have conflicting-schemas, we must merge them
			best_schema.MergeSchemas(schema, options.null_padding);
		}
	}

	if (names.empty()) {
		names = best_schema.GetNames();
		return_types = best_schema.GetTypes();
	}
	if (only_header_or_empty_files == current_file && !options.columns_set) {
		for (auto &type : return_types) {
			D_ASSERT(type.id() == LogicalTypeId::BOOLEAN);
			// we default to varchar if all files are empty or only have a header after all the sniffing
			type = LogicalType::VARCHAR;
		}
	}
	result.csv_schema = best_schema;
}